

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcNtk.c
# Opt level: O0

void Wlc_NtkPrintNode(Wlc_Ntk_t *p,Wlc_Obj_t *pObj)

{
  FILE *pFile;
  uint uVar1;
  int iVar2;
  Wlc_Obj_t *pWVar3;
  char *pcVar4;
  word *pTruth;
  char *pcVar5;
  int local_1c;
  int k;
  Wlc_Obj_t *pObj_local;
  Wlc_Ntk_t *p_local;
  
  uVar1 = Wlc_ObjId(p,pObj);
  printf("%8d  :  ",(ulong)uVar1);
  iVar2 = Vec_IntSize(&p->vLevels);
  if (iVar2 != 0) {
    iVar2 = Wlc_ObjId(p,pObj);
    uVar1 = Vec_IntEntry(&p->vLevels,iVar2);
    printf("Lev = %2d  ",(ulong)uVar1);
  }
  uVar1 = Wlc_ObjRange(pObj);
  iVar2 = Wlc_ObjIsSigned(pObj);
  pcVar5 = " ";
  if (iVar2 != 0) {
    pcVar5 = "s";
  }
  printf("%6d%s = ",(ulong)uVar1,pcVar5);
  if ((undefined1  [24])((undefined1  [24])*pObj & (undefined1  [24])0x3f) == (undefined1  [24])0x1)
  {
    iVar2 = Wlc_ObjId(p,pObj);
    pcVar5 = Wlc_ObjName(p,iVar2);
    printf("            PI                   :    %-12s\n",pcVar5);
  }
  else if ((undefined1  [24])((undefined1  [24])*pObj & (undefined1  [24])0x3f) ==
           (undefined1  [24])0x3) {
    iVar2 = Wlc_ObjId(p,pObj);
    pcVar5 = Wlc_ObjName(p,iVar2);
    pWVar3 = Wlc_ObjFo2Fi(p,pObj);
    iVar2 = Wlc_ObjId(p,pWVar3);
    pcVar4 = Wlc_ObjName(p,iVar2);
    printf("            FO                   :    %-12s = %-12s\n",pcVar5,pcVar4);
  }
  else if (((undefined1  [24])((undefined1  [24])*pObj & (undefined1  [24])0x3f) ==
            (undefined1  [24])0x6) || (iVar2 = Wlc_ObjFaninNum(pObj), iVar2 != 0)) {
    if ((undefined1  [24])((undefined1  [24])*pObj & (undefined1  [24])0x3f) ==
        (undefined1  [24])0x6) {
      printf("                                ");
    }
    else {
      pWVar3 = Wlc_ObjFanin0(p,pObj);
      uVar1 = Wlc_ObjRange(pWVar3);
      pWVar3 = Wlc_ObjFanin0(p,pObj);
      iVar2 = Wlc_ObjIsSigned(pWVar3);
      pcVar5 = " ";
      if (iVar2 != 0) {
        pcVar5 = "s";
      }
      printf("%6d%s  %5s  ",(ulong)uVar1,pcVar5,Wlc_Names[(int)(uint)(*(ushort *)pObj & 0x3f)]);
      iVar2 = Wlc_ObjFaninNum(pObj);
      if (iVar2 < 2) {
        printf("        ");
      }
      else {
        pWVar3 = Wlc_ObjFanin1(p,pObj);
        uVar1 = Wlc_ObjRange(pWVar3);
        pWVar3 = Wlc_ObjFanin1(p,pObj);
        iVar2 = Wlc_ObjIsSigned(pWVar3);
        pcVar5 = " ";
        if (iVar2 != 0) {
          pcVar5 = "s";
        }
        printf("%6d%s ",(ulong)uVar1,pcVar5);
      }
      iVar2 = Wlc_ObjFaninNum(pObj);
      if (iVar2 < 3) {
        printf("        ");
      }
      else {
        pWVar3 = Wlc_ObjFanin2(p,pObj);
        uVar1 = Wlc_ObjRange(pWVar3);
        pWVar3 = Wlc_ObjFanin2(p,pObj);
        iVar2 = Wlc_ObjIsSigned(pWVar3);
        pcVar5 = " ";
        if (iVar2 != 0) {
          pcVar5 = "s";
        }
        printf("%6d%s ",(ulong)uVar1,pcVar5);
      }
    }
    printf(" :    ");
    iVar2 = Wlc_ObjId(p,pObj);
    pcVar5 = Wlc_ObjName(p,iVar2);
    printf("%-12s",pcVar5);
    if ((undefined1  [24])((undefined1  [24])*pObj & (undefined1  [24])0x3f) ==
        (undefined1  [24])0x6) {
      uVar1 = Wlc_ObjRange(pObj);
      iVar2 = Wlc_ObjIsSigned(pObj);
      pcVar5 = "";
      if (iVar2 != 0) {
        pcVar5 = "s";
      }
      printf(" = %d\'%sh",(ulong)uVar1,pcVar5);
      pFile = _stdout;
      if ((*(ushort *)pObj >> 0xb & 1) == 0) {
        pTruth = (word *)Wlc_ObjConstValue(pObj);
        iVar2 = Wlc_ObjRange(pObj);
        Abc_TtPrintHexArrayRev(pFile,pTruth,(iVar2 + 3) / 4);
      }
      else {
        for (local_1c = 0; iVar2 = Wlc_ObjRange(pObj), local_1c < (iVar2 + 3) / 4;
            local_1c = local_1c + 1) {
          printf("x");
        }
      }
    }
    else {
      iVar2 = Wlc_ObjFaninId0(pObj);
      pcVar5 = Wlc_ObjName(p,iVar2);
      printf(" =  %-12s  %5s  ",pcVar5,Wlc_Names[(int)(uint)(*(ushort *)pObj & 0x3f)]);
      iVar2 = Wlc_ObjFaninNum(pObj);
      if (iVar2 < 2) {
        printf("             ");
      }
      else {
        iVar2 = Wlc_ObjFaninId1(pObj);
        pcVar5 = Wlc_ObjName(p,iVar2);
        printf("%-12s ",pcVar5);
      }
      iVar2 = Wlc_ObjFaninNum(pObj);
      if (2 < iVar2) {
        iVar2 = Wlc_ObjFaninId2(pObj);
        pcVar5 = Wlc_ObjName(p,iVar2);
        printf("%-12s ",pcVar5);
      }
    }
    printf("\n");
  }
  else {
    iVar2 = Wlc_ObjId(p,pObj);
    pcVar5 = Wlc_ObjName(p,iVar2);
    printf("Unknown object without fanins    :    %-12s\n",pcVar5);
  }
  return;
}

Assistant:

void Wlc_NtkPrintNode( Wlc_Ntk_t * p, Wlc_Obj_t * pObj )
{
    printf( "%8d  :  ", Wlc_ObjId(p, pObj) );
    if ( Vec_IntSize(&p->vLevels) )
        printf( "Lev = %2d  ", Vec_IntEntry(&p->vLevels, Wlc_ObjId(p,pObj)) );
    printf( "%6d%s = ", Wlc_ObjRange(pObj), Wlc_ObjIsSigned(pObj) ? "s" : " " );
    if ( pObj->Type == WLC_OBJ_PI )
    {
        printf( "            PI                   :    %-12s\n", Wlc_ObjName(p, Wlc_ObjId(p, pObj)) );
        return;
    }
    if ( pObj->Type == WLC_OBJ_FO )
    {
        printf( "            FO                   :    %-12s = %-12s\n", Wlc_ObjName(p, Wlc_ObjId(p, pObj)), Wlc_ObjName(p, Wlc_ObjId(p, Wlc_ObjFo2Fi(p, pObj))) );
        return;
    }
    if ( pObj->Type != WLC_OBJ_CONST && Wlc_ObjFaninNum(pObj) == 0 )
    {
        printf( "Unknown object without fanins    :    %-12s\n", Wlc_ObjName(p, Wlc_ObjId(p, pObj)) );
        return;
    }
    if ( pObj->Type != WLC_OBJ_CONST )
    {
        printf( "%6d%s  %5s  ",  Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)), Wlc_ObjIsSigned(Wlc_ObjFanin0(p, pObj)) ? "s" : " ", Wlc_Names[(int)pObj->Type] );
        if ( Wlc_ObjFaninNum(pObj) > 1 )
            printf( "%6d%s ",       Wlc_ObjRange(Wlc_ObjFanin1(p, pObj)), Wlc_ObjIsSigned(Wlc_ObjFanin1(p, pObj)) ? "s" : " " );
        else
            printf( "        " );
        if ( Wlc_ObjFaninNum(pObj) > 2 )
            printf( "%6d%s ",       Wlc_ObjRange(Wlc_ObjFanin2(p, pObj)), Wlc_ObjIsSigned(Wlc_ObjFanin2(p, pObj)) ? "s" : " " );
        else
            printf( "        " );
    }
    else
        printf( "                                " );
    printf( " :    " );
    printf( "%-12s",   Wlc_ObjName(p, Wlc_ObjId(p, pObj)) );
    if ( pObj->Type == WLC_OBJ_CONST )
    {
        printf( " = %d\'%sh", Wlc_ObjRange(pObj), Wlc_ObjIsSigned(pObj) ? "s":"" );
        if ( pObj->fXConst )
        {
            int k;
            for ( k = 0; k < (Wlc_ObjRange(pObj) + 3) / 4; k++ )
                printf( "x" );
        }
        else
            Abc_TtPrintHexArrayRev( stdout, (word *)Wlc_ObjConstValue(pObj), (Wlc_ObjRange(pObj) + 3) / 4 );
    }
    else
    {
        printf( " =  %-12s  %5s  ", Wlc_ObjName(p, Wlc_ObjFaninId0(pObj)), Wlc_Names[(int)pObj->Type] );
        if ( Wlc_ObjFaninNum(pObj) > 1 )
            printf( "%-12s ",       Wlc_ObjName(p, Wlc_ObjFaninId1(pObj)) );
        else
            printf( "             " );
        if ( Wlc_ObjFaninNum(pObj) > 2 )
            printf( "%-12s ",       Wlc_ObjName(p, Wlc_ObjFaninId2(pObj)) );
    }
    printf( "\n" );
}